

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IrisUtils.cpp
# Opt level: O0

void IRIS::SaveSplit(string *path,Dataset *dataset)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  reference pvVar4;
  int local_234;
  int local_230;
  int paramId_1;
  int sampleId_1;
  int paramId;
  int sampleId;
  ostream local_218 [8];
  ofstream file;
  Dataset *dataset_local;
  string *path_local;
  
  std::ofstream::ofstream(local_218,path,0x10);
  sVar1 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(&dataset->xTrain);
  poVar2 = (ostream *)std::ostream::operator<<(local_218,sVar1);
  std::operator<<(poVar2,"\n");
  sampleId_1 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(&dataset->xTrain);
    if (sVar1 <= (ulong)(long)sampleId_1) break;
    paramId_1 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&dataset->xTrain,0);
      sVar1 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
      if (sVar1 <= (ulong)(long)paramId_1) break;
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&dataset->xTrain,(long)sampleId_1);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)paramId_1);
      poVar2 = (ostream *)std::ostream::operator<<(local_218,*pvVar4);
      std::operator<<(poVar2," ");
      paramId_1 = paramId_1 + 1;
    }
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&dataset->yTrain,(long)sampleId_1);
    poVar2 = (ostream *)std::ostream::operator<<(local_218,*pvVar4);
    std::operator<<(poVar2,"\n");
    sampleId_1 = sampleId_1 + 1;
  }
  sVar1 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(&dataset->xTest);
  poVar2 = (ostream *)std::ostream::operator<<(local_218,sVar1);
  std::operator<<(poVar2,"\n");
  local_230 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(&dataset->xTest);
    if (sVar1 <= (ulong)(long)local_230) break;
    local_234 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&dataset->xTest,0);
      sVar1 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
      if (sVar1 <= (ulong)(long)local_234) break;
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&dataset->xTest,(long)local_230);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)local_234);
      poVar2 = (ostream *)std::ostream::operator<<(local_218,*pvVar4);
      std::operator<<(poVar2," ");
      local_234 = local_234 + 1;
    }
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&dataset->yTest,(long)local_230)
    ;
    poVar2 = (ostream *)std::ostream::operator<<(local_218,*pvVar4);
    std::operator<<(poVar2,"\n");
    local_230 = local_230 + 1;
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void IRIS::SaveSplit( const std::string &path, SPIKING_NN::Dataset &dataset )
{
    std::ofstream file( path );
    file << dataset.xTrain.size() << "\n";
    for ( int sampleId = 0; sampleId < dataset.xTrain.size(); ++sampleId ) {
        for ( int paramId = 0; paramId < dataset.xTrain[0].size(); ++paramId ) {
            file << dataset.xTrain[sampleId][paramId] << " ";
        }
        file << dataset.yTrain[sampleId] << "\n";
    }
    file << dataset.xTest.size() << "\n";
    for ( int sampleId = 0; sampleId < dataset.xTest.size(); ++sampleId ) {
        for ( int paramId = 0; paramId < dataset.xTest[0].size(); ++paramId ) {
            file << dataset.xTest[sampleId][paramId] << " ";
        }
        file << dataset.yTest[sampleId] << "\n";
    }
}